

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O2

int __thiscall TestHarness::PickType(TestHarness *this)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  pointer pTVar6;
  
  if (this->num_tests_ < 50000) {
    this->num_tests_ = this->num_tests_ + 1;
    if (this->total_weight_ < 1) {
      pcVar5 = "Check failed: total_weight_ > 0\n";
LAB_0010c843:
      syscall(1,2,pcVar5,0x20);
      abort();
    }
    iVar2 = Uniform(this,this->total_weight_);
    pTVar6 = (this->types_).
             super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = ((long)(this->types_).
                   super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl
                   .super__Vector_impl_data._M_finish - (long)pTVar6) / 0x28 + 1;
    lVar1 = 0;
    do {
      lVar4 = lVar1;
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        pcVar5 = "Check failed: i < types_.size()\n";
        goto LAB_0010c843;
      }
      iVar2 = iVar2 - *(int *)((long)&pTVar6->weight + lVar4);
      lVar1 = lVar4 + 0x28;
    } while (-1 < iVar2);
    if (this->num_tests_ % 50000 == 0) {
      printf("  Test %d out of %d: %s\n",(ulong)(uint)this->num_tests_,50000,
             *(undefined8 *)((long)&(pTVar6->name)._M_dataplus + lVar4));
      pTVar6 = (this->types_).
               super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
               super__Vector_impl_data._M_start;
    }
    iVar2 = *(int *)((long)&pTVar6->type + lVar4);
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int TestHarness::PickType() {
  if (num_tests_ >= FLAGS_numtests) return -1;
  num_tests_++;

  CHECK(total_weight_ > 0);
  // This is a little skewed if total_weight_ doesn't divide 2^31, but it's close
  int v = Uniform(total_weight_);
  int i;
  for (i = 0; i < types_.size(); i++) {
    v -= types_[i].weight;
    if (v < 0) {
      break;
    }
  }

  CHECK(i < types_.size());
  if ((num_tests_ % FLAGS_log_every_n_tests) == 0) {
    printf("  Test %d out of %d: %s\n",
            num_tests_, FLAGS_numtests, types_[i].name.c_str());
  }
  return types_[i].type;
}